

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O0

void __thiscall UnitTest_lex1::Run(UnitTest_lex1 *this)

{
  int iVar1;
  LexerWrapper lexer;
  undefined4 in_stack_fffffffffffffe50;
  allocator local_191;
  LexerWrapper *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe88;
  UnitTestBase *in_stack_fffffffffffffe90;
  allocator local_159;
  string local_158 [48];
  string *in_stack_fffffffffffffed8;
  LexerWrapper *in_stack_fffffffffffffee0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"\r\n\t\v\f ",&local_159);
  anon_unknown.dwarf_2562::LexerWrapper::LexerWrapper
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  iVar1 = anon_unknown.dwarf_2562::LexerWrapper::GetToken(in_stack_fffffffffffffe70);
  if (iVar1 != 0x11e) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe70,"\'lexer.GetToken() == luna::Token_EOF\'",
               &local_191);
    UnitTestBase::Error(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
  }
  anon_unknown.dwarf_2562::LexerWrapper::~LexerWrapper
            ((LexerWrapper *)CONCAT44(iVar1,in_stack_fffffffffffffe50));
  return;
}

Assistant:

TEST_CASE(lex1)
{
    LexerWrapper lexer("\r\n\t\v\f ");
    EXPECT_TRUE(lexer.GetToken() == luna::Token_EOF);
}